

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum-dtoa.cc
# Opt level: O0

void __thiscall
FIX::double_conversion::BignumDtoa
          (double_conversion *this,double v,BignumDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  int *this_00;
  int *this_01;
  int *this_02;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  char *pcVar4;
  undefined4 in_register_00000014;
  int *piVar5;
  bool local_921;
  undefined1 local_8f0 [8];
  Bignum delta_plus;
  Bignum delta_minus;
  Bignum denominator;
  Bignum numerator;
  int estimated_power;
  int normalized_exponent;
  bool is_even;
  bool need_boundary_deltas;
  Double local_78;
  Double local_70;
  Single local_68;
  Single local_64;
  Single local_60;
  float local_5c;
  bool local_55;
  float f;
  bool lower_boundary_is_closer;
  ulong uStack_50;
  int exponent;
  uint64_t significand;
  int *local_40;
  int *decimal_point_local;
  int *length_local;
  int requested_digits_local;
  BignumDtoaMode mode_local;
  double v_local;
  Vector<char> buffer_local;
  
  v_local = (double)CONCAT44(in_register_00000014,requested_digits);
  decimal_point_local = buffer._8_8_;
  buffer_local.start_._0_4_ = (uint)buffer.start_;
  length_local._4_4_ = (uint)this;
  local_40 = length;
  length_local._0_4_ = mode;
  _requested_digits_local = v;
  if (v <= 0.0) {
    __assert_fail("v > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                  ,0x5b,
                  "void FIX::double_conversion::BignumDtoa(double, BignumDtoaMode, int, Vector<char>, int *, int *)"
                 );
  }
  Double::Double((Double *)&significand,v);
  bVar1 = Double::IsSpecial((Double *)&significand);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!Double(v).IsSpecial()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                  ,0x5c,
                  "void FIX::double_conversion::BignumDtoa(double, BignumDtoaMode, int, Vector<char>, int *, int *)"
                 );
  }
  if (length_local._4_4_ == 1) {
    local_5c = (float)_requested_digits_local;
    if (((double)local_5c != _requested_digits_local) ||
       (NAN((double)local_5c) || NAN(_requested_digits_local))) {
      __assert_fail("f == v",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum-dtoa.cc"
                    ,0x62,
                    "void FIX::double_conversion::BignumDtoa(double, BignumDtoaMode, int, Vector<char>, int *, int *)"
                   );
    }
    Single::Single(&local_60,local_5c);
    uVar2 = Single::Significand(&local_60);
    uStack_50 = (ulong)uVar2;
    Single::Single(&local_64,local_5c);
    f = (float)Single::Exponent(&local_64);
    Single::Single(&local_68,local_5c);
    local_55 = Single::LowerBoundaryIsCloser(&local_68);
  }
  else {
    Double::Double(&local_70,_requested_digits_local);
    uStack_50 = Double::Significand(&local_70);
    Double::Double(&local_78,_requested_digits_local);
    f = (float)Double::Exponent(&local_78);
    Double::Double((Double *)&normalized_exponent,_requested_digits_local);
    local_55 = Double::LowerBoundaryIsCloser((Double *)&normalized_exponent);
  }
  local_921 = length_local._4_4_ < 2;
  bVar1 = (uStack_50 & 1) == 0;
  iVar3 = NormalizedExponent(uStack_50,(int)f);
  iVar3 = EstimatePower(iVar3);
  if ((length_local._4_4_ == 2) && ((int)(BignumDtoaMode)length_local < -1 - iVar3)) {
    pcVar4 = Vector<char>::operator[]((Vector<char> *)&v_local,0);
    *pcVar4 = '\0';
    *decimal_point_local = 0;
    *local_40 = -(BignumDtoaMode)length_local;
  }
  else {
    this_00 = &denominator.used_digits_;
    Bignum::Bignum((Bignum *)this_00);
    this_01 = &delta_minus.used_digits_;
    Bignum::Bignum((Bignum *)this_01);
    this_02 = &delta_plus.used_digits_;
    Bignum::Bignum((Bignum *)this_02);
    Bignum::Bignum((Bignum *)local_8f0);
    piVar5 = this_02;
    InitialScaledStartValues
              (uStack_50,(int)f,(bool)(local_55 & 1),iVar3,local_921,(Bignum *)this_00,
               (Bignum *)this_01,(Bignum *)this_02,(Bignum *)local_8f0);
    FixupMultiply10(iVar3,bVar1,local_40,(Bignum *)this_00,(Bignum *)this_01,(Bignum *)this_02,
                    (Bignum *)local_8f0);
    if (length_local._4_4_ < 2) {
      buffer_00._12_4_ = buffer_local.start_._4_4_;
      buffer_00.length_ = (uint)buffer_local.start_;
      buffer_00.start_ = (char *)v_local;
      GenerateShortestDigits
                ((Bignum *)&denominator.used_digits_,(Bignum *)&delta_minus.used_digits_,
                 (Bignum *)&delta_plus.used_digits_,(Bignum *)local_8f0,bVar1,buffer_00,
                 decimal_point_local);
    }
    else if (length_local._4_4_ == 2) {
      buffer_01._8_8_ = piVar5;
      buffer_01.start_ = (char *)decimal_point_local;
      BignumToFixed((double_conversion *)(ulong)(BignumDtoaMode)length_local,(int)local_40,
                    &denominator.used_digits_,(Bignum *)&delta_minus.used_digits_,(Bignum *)v_local,
                    buffer_01,(int *)(ulong)(uint)buffer_local.start_);
    }
    else {
      if (length_local._4_4_ != 3) {
        abort();
      }
      buffer_02._8_8_ = piVar5;
      buffer_02.start_ = (char *)decimal_point_local;
      GenerateCountedDigits
                ((double_conversion *)(ulong)(BignumDtoaMode)length_local,(int)local_40,
                 &denominator.used_digits_,(Bignum *)&delta_minus.used_digits_,(Bignum *)v_local,
                 buffer_02,(int *)(ulong)(uint)buffer_local.start_);
    }
    pcVar4 = Vector<char>::operator[]((Vector<char> *)&v_local,*decimal_point_local);
    *pcVar4 = '\0';
  }
  return;
}

Assistant:

void BignumDtoa(double v, BignumDtoaMode mode, int requested_digits,
                Vector<char> buffer, int* length, int* decimal_point) {
  ASSERT(v > 0);
  ASSERT(!Double(v).IsSpecial());
  uint64_t significand;
  int exponent;
  bool lower_boundary_is_closer;
  if (mode == BIGNUM_DTOA_SHORTEST_SINGLE) {
    float f = static_cast<float>(v);
    ASSERT(f == v);
    significand = Single(f).Significand();
    exponent = Single(f).Exponent();
    lower_boundary_is_closer = Single(f).LowerBoundaryIsCloser();
  } else {
    significand = Double(v).Significand();
    exponent = Double(v).Exponent();
    lower_boundary_is_closer = Double(v).LowerBoundaryIsCloser();
  }
  bool need_boundary_deltas =
      (mode == BIGNUM_DTOA_SHORTEST || mode == BIGNUM_DTOA_SHORTEST_SINGLE);

  bool is_even = (significand & 1) == 0;
  int normalized_exponent = NormalizedExponent(significand, exponent);
  // estimated_power might be too low by 1.
  int estimated_power = EstimatePower(normalized_exponent);

  // Shortcut for Fixed.
  // The requested digits correspond to the digits after the point. If the
  // number is much too small, then there is no need in trying to get any
  // digits.
  if (mode == BIGNUM_DTOA_FIXED && -estimated_power - 1 > requested_digits) {
    buffer[0] = '\0';
    *length = 0;
    // Set decimal-point to -requested_digits. This is what Gay does.
    // Note that it should not have any effect anyways since the string is
    // empty.
    *decimal_point = -requested_digits;
    return;
  }

  Bignum numerator;
  Bignum denominator;
  Bignum delta_minus;
  Bignum delta_plus;
  // Make sure the bignum can grow large enough. The smallest double equals
  // 4e-324. In this case the denominator needs fewer than 324*4 binary digits.
  // The maximum double is 1.7976931348623157e308 which needs fewer than
  // 308*4 binary digits.
  ASSERT(Bignum::kMaxSignificantBits >= 324*4);
  InitialScaledStartValues(significand, exponent, lower_boundary_is_closer,
                           estimated_power, need_boundary_deltas,
                           &numerator, &denominator,
                           &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^estimated_power.
  FixupMultiply10(estimated_power, is_even, decimal_point,
                  &numerator, &denominator,
                  &delta_minus, &delta_plus);
  // We now have v = (numerator / denominator) * 10^(decimal_point-1), and
  //  1 <= (numerator + delta_plus) / denominator < 10
  switch (mode) {
    case BIGNUM_DTOA_SHORTEST:
    case BIGNUM_DTOA_SHORTEST_SINGLE:
      GenerateShortestDigits(&numerator, &denominator,
                             &delta_minus, &delta_plus,
                             is_even, buffer, length);
      break;
    case BIGNUM_DTOA_FIXED:
      BignumToFixed(requested_digits, decimal_point,
                    &numerator, &denominator,
                    buffer, length);
      break;
    case BIGNUM_DTOA_PRECISION:
      GenerateCountedDigits(requested_digits, decimal_point,
                            &numerator, &denominator,
                            buffer, length);
      break;
    default:
      UNREACHABLE();
  }
  buffer[*length] = '\0';
}